

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O3

HRESULT CreateAndRunSerializedScript
                  (char *fileName,LPCSTR fileContents,size_t fileLength,
                  JsFinalizeCallback fileContentsFinalizeCallback,char *fullPath)

{
  bool bVar1;
  HRESULT HVar2;
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  char16_t *format;
  JsValueRef local_68;
  JsValueRef bufferVal;
  char *local_58;
  size_t local_50;
  JsRuntimeHandle local_48;
  JsRuntimeHandle runtime;
  JsContextRef context;
  JsContextRef current;
  
  local_48 = (JsRuntimeHandle)0x0;
  runtime = (JsRuntimeHandle)0x0;
  context = (JsContextRef)0x0;
  bufferVal = fileName;
  GetSerializedBuffer(fileContents,(JsFinalizeCallback)0x0,&local_68);
  HVar2 = CreateRuntime(&local_48);
  if (-1 < HVar2) {
    chRuntime = local_48;
    local_58 = fullPath;
    local_50 = fileLength;
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(local_48,&runtime);
    if (jsErrorCode == JsNoError) {
      jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetCurrentContext)(&context);
      if (jsErrorCode == JsNoError) {
        jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(runtime);
        if (jsErrorCode == JsNoError) {
          HVar2 = -0x7fffbffb;
          bVar1 = WScriptJsrt::Initialize();
          if (bVar1) {
            HVar2 = RunScript((char *)bufferVal,fileContents,local_50,fileContentsFinalizeCallback,
                              local_68,local_58,(JsValueRef)0x0);
            goto LAB_00109189;
          }
          goto LAB_0010917e;
        }
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
      }
      else {
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsGetCurrentContext(&current) failed. JsErrorCode=0x%x (%s)\n";
      }
    }
    else {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode);
      format = 
      L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar3,format,(ulong)jsErrorCode,pWVar4);
    pPVar3 = PAL_get_stderr(0);
    PAL_fflush(pPVar3);
  }
LAB_0010917e:
  if (fileContentsFinalizeCallback != (JsFinalizeCallback)0x0) {
    (*fileContentsFinalizeCallback)(fileContents);
  }
LAB_00109189:
  if (context != (JsContextRef)0x0) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(context);
  }
  if (local_48 != (JsRuntimeHandle)0x0) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(local_48);
  }
  return HVar2;
}

Assistant:

HRESULT CreateAndRunSerializedScript(const char* fileName, LPCSTR fileContents, size_t fileLength, JsFinalizeCallback fileContentsFinalizeCallback, char *fullPath)
{
    HRESULT hr = S_OK;
    JsRuntimeHandle runtime = JS_INVALID_RUNTIME_HANDLE;
    JsContextRef context = JS_INVALID_REFERENCE, current = JS_INVALID_REFERENCE;
    JsValueRef bufferVal;

    // We don't want this to free fileContents when it completes, so the finalizeCallback is nullptr
    IfFailedGoLabel(GetSerializedBuffer(fileContents, nullptr, &bufferVal), ErrorRunFinalize);

    // Bytecode buffer is created in one runtime and will be executed on different runtime.

    IfFailedGoLabel(CreateRuntime(&runtime), ErrorRunFinalize);
    chRuntime = runtime;

    IfJsErrorFailLogLabel(ChakraRTInterface::JsCreateContext(runtime, &context), ErrorRunFinalize);
    IfJsErrorFailLogLabel(ChakraRTInterface::JsGetCurrentContext(&current), ErrorRunFinalize);
    IfJsErrorFailLogLabel(ChakraRTInterface::JsSetCurrentContext(context), ErrorRunFinalize);

    // Initialized the WScript object on the new context
    if (!WScriptJsrt::Initialize())
    {
        IfFailedGoLabel(E_FAIL, ErrorRunFinalize);
    }

    // This is our last call to use fileContents, so pass in the finalizeCallback
    IfFailGo(RunScript(fileName, fileContents, fileLength, fileContentsFinalizeCallback, bufferVal, fullPath, nullptr));

    if(false)
    {
ErrorRunFinalize:
        if(fileContentsFinalizeCallback != nullptr)
        {
            fileContentsFinalizeCallback((void*)fileContents);
        }
    }
Error:
    if (current != JS_INVALID_REFERENCE)
    {
        ChakraRTInterface::JsSetCurrentContext(current);
    }

    if (runtime != JS_INVALID_RUNTIME_HANDLE)
    {
        ChakraRTInterface::JsDisposeRuntime(runtime);
    }

    return hr;
}